

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

SymbolListCItr __thiscall
Jinx::Impl::Parser::GetNextSymbolOfType(Parser *this,SymbolType type,SymbolListCItr endSymbol)

{
  SymbolListCItr SVar1;
  Symbol *pSVar2;
  
  for (pSVar2 = (this->m_currentSymbol)._M_current;
      ((SVar1._M_current = endSymbol._M_current, pSVar2 != endSymbol._M_current &&
       (pSVar2 != (this->m_symbolList->
                  super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                  _M_impl.super__Vector_impl_data._M_finish)) &&
      (SVar1._M_current = pSVar2, pSVar2->type != type)); pSVar2 = pSVar2 + 1) {
  }
  return (SymbolListCItr)SVar1._M_current;
}

Assistant:

inline_t SymbolListCItr Parser::GetNextSymbolOfType(SymbolType type, SymbolListCItr endSymbol) const
	{
		auto curr = m_currentSymbol;
		while (curr != endSymbol && curr != m_symbolList.end())
		{
			if (curr->type == type)
			{
				endSymbol = curr;
				break;
			}
			++curr;
		}
		return endSymbol;
	}